

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  ~IfcStructuralPointAction
            ((IfcStructuralPointAction *)
             (&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
               super_IfcObject.field_0x0 +
             *(long *)(*(long *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.
                                 super_IfcProduct.super_IfcObject + -0x18)));
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}